

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall
Client::Client(Client *this,Server *server,Client *client,Address *clientAddr,ICallback *callback,
              Settings *settings)

{
  (this->super_ICallback)._vptr_ICallback = (_func_int **)&PTR_onRead_00122a20;
  (this->super_ICallback)._vptr_ICallback = (_func_int **)&DAT_00122a68;
  (this->super_ICallback)._vptr_ICallback = (_func_int **)&DAT_00122a88;
  this->_server = server;
  this->_handle = client;
  this->_callback = callback;
  this->_settings = settings;
  this->_proxyLine = (ProxyLine *)0x0;
  this->_directLine = (DirectLine *)0x0;
  this->_activeLine = (Client *)0x0;
  this->_address = *clientAddr;
  (this->_destination).addr = 0;
  (this->_destination).port = 0;
  (this->_destinationHostname).data = &String::emptyData.super_Data;
  this->_lastReadActivity = 0;
  return;
}

Assistant:

Client::Client(Server& server, Server::Client& client, const Address& clientAddr, ICallback& callback, Settings& settings)
    : _server(server)
    , _handle(client)
    , _callback(callback)
    , _settings(settings)
    , _proxyLine(nullptr)
    , _directLine(nullptr)
    , _activeLine(nullptr)
    , _address(clientAddr)
    , _lastReadActivity(0)
{
    ;
}